

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void boost::this_thread::interruption_point(void)

{
  thread_data_base *ptVar1;
  undefined8 uVar2;
  lock_guard<boost::mutex> lg;
  thread_data_base *thread_info;
  mutex *in_stack_ffffffffffffffd8;
  lock_guard<boost::mutex> *in_stack_ffffffffffffffe0;
  
  ptVar1 = detail::get_current_thread_data();
  if ((ptVar1 != (thread_data_base *)0x0) && ((ptVar1->interrupt_enabled & 1U) != 0)) {
    lock_guard<boost::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if ((ptVar1->interrupt_requested & 1U) != 0) {
      ptVar1->interrupt_requested = false;
      uVar2 = __cxa_allocate_exception(1);
      __cxa_throw(uVar2,&thread_interrupted::typeinfo,0);
    }
    lock_guard<boost::mutex>::~lock_guard((lock_guard<boost::mutex> *)0x2a44b4);
  }
  return;
}

Assistant:

void interruption_point()
        {
#ifndef BOOST_NO_EXCEPTIONS
            boost::detail::thread_data_base* const thread_info=detail::get_current_thread_data();
            if(thread_info && thread_info->interrupt_enabled)
            {
                lock_guard<mutex> lg(thread_info->data_mutex);
                if(thread_info->interrupt_requested)
                {
                    thread_info->interrupt_requested=false;
                    throw thread_interrupted();
                }
            }
#endif
        }